

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ProcessRTPPacket
          (RTPSources *this,RTPPacket *rtppack,RTPTime *receivetime,RTPAddress *senderaddress,
          bool *stored)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  int local_b4;
  int i_1;
  int num;
  bool createdcsrc;
  RTPInternalSourceData *csrcdat;
  int i;
  int numCSRCs;
  uint32_t CSRCs [15];
  bool local_4d;
  int local_4c;
  bool prevactive;
  bool prevsender;
  bool created;
  RTPInternalSourceData *pRStack_48;
  int status;
  RTPInternalSourceData *srcdat;
  bool *pbStack_38;
  uint32_t ssrc;
  bool *stored_local;
  RTPAddress *senderaddress_local;
  RTPTime *receivetime_local;
  RTPPacket *rtppack_local;
  RTPSources *this_local;
  
  pbStack_38 = stored;
  stored_local = (bool *)senderaddress;
  senderaddress_local = (RTPAddress *)receivetime;
  receivetime_local = (RTPTime *)rtppack;
  rtppack_local = (RTPPacket *)this;
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[2])(this,rtppack,receivetime,senderaddress);
  *pbStack_38 = false;
  srcdat._4_4_ = RTPPacket::GetSSRC((RTPPacket *)receivetime_local);
  local_4c = ObtainSourceDataInstance(this,srcdat._4_4_,&stack0xffffffffffffffb8,&local_4d);
  this_local._4_4_ = local_4c;
  if (-1 < local_4c) {
    if ((local_4d & 1U) == 0) {
      bVar2 = CheckCollision(this,pRStack_48,(RTPAddress *)stored_local,true);
      if (bVar2) {
        return 0;
      }
    }
    else {
      local_4c = RTPInternalSourceData::SetRTPDataAddress(pRStack_48,(RTPAddress *)stored_local);
      if (local_4c < 0) {
        return local_4c;
      }
    }
    bVar2 = RTPSourceData::IsSender(&pRStack_48->super_RTPSourceData);
    bVar3 = RTPSourceData::IsActive(&pRStack_48->super_RTPSourceData);
    csrcdat._4_4_ = RTPPacket::GetCSRCCount((RTPPacket *)receivetime_local);
    if (0xf < csrcdat._4_4_) {
      csrcdat._4_4_ = 0xf;
    }
    for (csrcdat._0_4_ = 0; (int)csrcdat < csrcdat._4_4_; csrcdat._0_4_ = (int)csrcdat + 1) {
      uVar4 = RTPPacket::GetCSRC((RTPPacket *)receivetime_local,(int)csrcdat);
      (&i)[(int)csrcdat] = uVar4;
    }
    local_4c = RTPInternalSourceData::ProcessRTPPacket
                         (pRStack_48,(RTPPacket *)receivetime_local,(RTPTime *)senderaddress_local,
                          pbStack_38,this);
    this_local._4_4_ = local_4c;
    if (-1 < local_4c) {
      if ((!bVar2) && (bVar2 = RTPSourceData::IsSender(&pRStack_48->super_RTPSourceData), bVar2)) {
        this->sendercount = this->sendercount + 1;
      }
      if ((!bVar3) && (bVar2 = RTPSourceData::IsActive(&pRStack_48->super_RTPSourceData), bVar2)) {
        this->activecount = this->activecount + 1;
      }
      if ((local_4d & 1U) != 0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,pRStack_48);
      }
      bVar2 = RTPSourceData::IsValidated(&pRStack_48->super_RTPSourceData);
      iVar1 = csrcdat._4_4_;
      if (bVar2) {
        for (local_b4 = 0; local_b4 < iVar1; local_b4 = local_b4 + 1) {
          local_4c = ObtainSourceDataInstance
                               (this,(&i)[local_b4],(RTPInternalSourceData **)&num,
                                (bool *)((long)&i_1 + 3));
          if (local_4c < 0) {
            return local_4c;
          }
          if ((i_1._3_1_ & 1) == 0) {
            bVar2 = CheckCollision(this,_num,(RTPAddress *)stored_local,true);
            if (!bVar2) {
              RTPInternalSourceData::SetCSRC(_num);
            }
          }
          else {
            RTPInternalSourceData::SetCSRC(_num);
            bVar2 = RTPSourceData::IsActive(&_num->super_RTPSourceData);
            if (bVar2) {
              this->activecount = this->activecount + 1;
            }
            (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,_num);
          }
        }
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::ProcessRTPPacket(RTPPacket *rtppack,const RTPTime &receivetime,const RTPAddress *senderaddress,bool *stored)
{
	uint32_t ssrc;
	RTPInternalSourceData *srcdat;
	int status;
	bool created;

	OnRTPPacket(rtppack,receivetime,senderaddress);

	*stored = false;
	
	ssrc = rtppack->GetSSRC();
	if ((status = ObtainSourceDataInstance(ssrc,&srcdat,&created)) < 0)
		return status;

	if (created)
	{
		if ((status = srcdat->SetRTPDataAddress(senderaddress)) < 0)
			return status;
	}
	else // got a previously existing source
	{
		if (CheckCollision(srcdat,senderaddress,true))
			return 0; // ignore packet on collision
	}
	
	bool prevsender = srcdat->IsSender();
	bool prevactive = srcdat->IsActive();
	
	uint32_t CSRCs[RTP_MAXCSRCS];
	int numCSRCs = rtppack->GetCSRCCount();
	if (numCSRCs > RTP_MAXCSRCS) // shouldn't happen, but better to check than go out of bounds
		numCSRCs = RTP_MAXCSRCS;

	for (int i = 0 ; i < numCSRCs ; i++)
		CSRCs[i] = rtppack->GetCSRC(i);

	// The packet comes from a valid source, we can process it further now
	// The following function should delete rtppack itself if something goes
	// wrong
	if ((status = srcdat->ProcessRTPPacket(rtppack,receivetime,stored,this)) < 0)
		return status;

	// NOTE: we cannot use 'rtppack' anymore since it may have been deleted in
	//       OnValidatedRTPPacket

	if (!prevsender && srcdat->IsSender())
		sendercount++;
	if (!prevactive && srcdat->IsActive())
		activecount++;

	if (created)
		OnNewSource(srcdat);

	if (srcdat->IsValidated()) // process the CSRCs
	{
		RTPInternalSourceData *csrcdat;
		bool createdcsrc;

		int num = numCSRCs;
		int i;

		for (i = 0 ; i < num ; i++)
		{
			if ((status = ObtainSourceDataInstance(CSRCs[i],&csrcdat,&createdcsrc)) < 0)
				return status;
			if (createdcsrc)
			{
				csrcdat->SetCSRC();
				if (csrcdat->IsActive())
					activecount++;
				OnNewSource(csrcdat);
			}
			else // already found an entry, possibly because of RTCP data
			{
				if (!CheckCollision(csrcdat,senderaddress,true))
					csrcdat->SetCSRC();
			}
		}
	}
	
	return 0;
}